

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_transaction.cpp
# Opt level: O3

void __thiscall
TransactionApi_FundRawTransaction_LimitAmountValue_Test::TestBody
          (TransactionApi_FundRawTransaction_LimitAmountValue_Test *this)

{
  pointer pcVar1;
  Txid *this_00;
  void *pvVar2;
  bool bVar3;
  uint32_t uVar4;
  char *pcVar5;
  long lVar6;
  Amount AVar7;
  initializer_list<cfd::UtxoData> __l;
  AssertionResult gtest_ar_2;
  TransactionApi api;
  uint32_t minimum_fee;
  ByteData tx;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> selected_txin_utxos;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  Amount estimate_fee;
  AddressFactory factory;
  Amount target_value;
  Amount fee;
  TransactionContext txc;
  CoinSelectionOption option;
  AssertionResult gtest_ar;
  Address address;
  TransactionController tx_obj;
  UtxoData utxo3;
  UtxoData utxo2;
  UtxoData utxo1;
  Address address3;
  Address address2;
  undefined1 local_2660 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2658;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2650;
  Privkey local_2640;
  TransactionApi local_2619;
  Pubkey local_2618;
  string local_2600;
  ByteData local_25e0;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_25c8;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_25a8;
  Amount local_2590;
  SigHashType local_257c;
  SigHashType local_2570;
  SigHashType local_2564;
  AddressFactory local_2558;
  Amount local_2530;
  Amount local_2520;
  TransactionContext local_2510;
  undefined1 local_2458 [56];
  undefined **local_2420;
  pointer local_2418;
  pointer local_2408;
  undefined1 local_23f0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_23e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_23e0 [81];
  UtxoData local_1ec8;
  UtxoData local_19a0;
  undefined1 local_1478 [384];
  TransactionController local_12f8;
  undefined1 local_12a8 [40];
  Txid local_1280;
  uint32_t local_1260;
  Script local_1258 [2];
  Address local_11e8;
  undefined1 local_1068 [8];
  char *local_1060;
  Amount local_1048;
  AddressType local_1038;
  void *local_1030;
  undefined1 local_d80 [40];
  Txid local_d58;
  uint32_t local_d38;
  Script local_d30 [2];
  Address local_cc0;
  undefined1 local_b40 [8];
  char *local_b38;
  Amount local_b20;
  AddressType local_b10;
  void *local_b08;
  UtxoData local_858;
  Address local_330;
  Address local_1b0;
  
  cfd::AddressFactory::AddressFactory(&local_2558,kRegtest);
  cfd::UtxoData::UtxoData(&local_858);
  local_858.block_height = 0;
  local_858.binary_data = (void *)0x0;
  pcVar1 = local_d80 + 0x10;
  local_d80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d80,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             "");
  cfd::core::Txid::Txid((Txid *)local_23f0,(string *)local_d80);
  this_00 = &local_858.txid;
  cfd::core::Txid::operator=(this_00,(Txid *)local_23f0);
  local_23f0 = (undefined1  [8])&PTR__Txid_0086d9f8;
  pvVar2 = (void *)CONCAT71(local_23e8.ptr_._1_7_,local_23e8.ptr_._0_1_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,local_23e0[0]._8_8_ - (long)pvVar2);
  }
  if ((pointer)local_d80._0_8_ != pcVar1) {
    operator_delete((void *)local_d80._0_8_,local_d80._16_8_ + 1);
  }
  local_858.vout = 0;
  local_d80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d80,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac","");
  cfd::core::Script::Script((Script *)local_23f0,(string *)local_d80);
  cfd::core::Script::operator=(&local_858.locking_script,(Script *)local_23f0);
  cfd::core::Script::~Script((Script *)local_23f0);
  if ((pointer)local_d80._0_8_ != pcVar1) {
    operator_delete((void *)local_d80._0_8_,local_d80._16_8_ + 1);
  }
  local_d80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d80,"n3gq7EMkVLyrpSxVxKLFX8qsqiDC5DcqfW","");
  cfd::AddressFactory::GetAddress((Address *)local_23f0,&local_2558,(string *)local_d80);
  cfd::core::Address::operator=(&local_858.address,(Address *)local_23f0);
  cfd::core::Address::~Address((Address *)local_23f0);
  if ((pointer)local_d80._0_8_ != pcVar1) {
    operator_delete((void *)local_d80._0_8_,local_d80._16_8_ + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_858.descriptor,0,(char *)local_858.descriptor._M_string_length,0x5b667b);
  cfd::core::Amount::Amount((Amount *)local_23f0,50000000000000);
  local_858.amount.ignore_check_ = local_23e8.ptr_._0_1_;
  local_858.amount.amount_ = (int64_t)local_23f0;
  local_858.address_type = kP2pkhAddress;
  cfd::UtxoData::UtxoData((UtxoData *)local_d80);
  local_d80._0_8_ = (pointer)0x0;
  local_b08 = (void *)0x0;
  pcVar1 = local_12a8 + 0x10;
  local_12a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12a8,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_23f0,(string *)local_12a8);
  cfd::core::Txid::operator=(&local_d58,(Txid *)local_23f0);
  local_23f0 = (undefined1  [8])&PTR__Txid_0086d9f8;
  pvVar2 = (void *)CONCAT71(local_23e8.ptr_._1_7_,local_23e8.ptr_._0_1_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,local_23e0[0]._8_8_ - (long)pvVar2);
  }
  if ((pointer)local_12a8._0_8_ != pcVar1) {
    operator_delete((void *)local_12a8._0_8_,local_12a8._16_8_ + 1);
  }
  local_d38 = 0;
  local_12a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12a8,"a9145d54db96a28f844a744e393fcd699d6f825b284187","");
  cfd::core::Script::Script((Script *)local_23f0,(string *)local_12a8);
  cfd::core::Script::operator=(local_d30,(Script *)local_23f0);
  cfd::core::Script::~Script((Script *)local_23f0);
  if ((pointer)local_12a8._0_8_ != pcVar1) {
    operator_delete((void *)local_12a8._0_8_,local_12a8._16_8_ + 1);
  }
  local_12a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12a8,"2N1kiV9NkmZetZ3j7FuWGkBZxubBMPLxJ16","");
  cfd::AddressFactory::GetAddress((Address *)local_23f0,&local_2558,(string *)local_12a8);
  cfd::core::Address::operator=(&local_cc0,(Address *)local_23f0);
  cfd::core::Address::~Address((Address *)local_23f0);
  if ((pointer)local_12a8._0_8_ != pcVar1) {
    operator_delete((void *)local_12a8._0_8_,local_12a8._16_8_ + 1);
  }
  std::__cxx11::string::_M_replace((ulong)local_b40,0,local_b38,0x57b2c5);
  cfd::core::Amount::Amount((Amount *)local_23f0,2000000000000000);
  local_b20.ignore_check_ = local_23e8.ptr_._0_1_;
  local_b20.amount_ = (int64_t)local_23f0;
  local_b10 = kP2shP2wpkhAddress;
  cfd::UtxoData::UtxoData((UtxoData *)local_12a8);
  local_12a8._0_8_ = (pointer)0x0;
  local_1030 = (void *)0x0;
  pcVar1 = local_1478 + 0x10;
  local_1478._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1478,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_23f0,(string *)local_1478);
  cfd::core::Txid::operator=(&local_1280,(Txid *)local_23f0);
  local_23f0 = (undefined1  [8])&PTR__Txid_0086d9f8;
  pvVar2 = (void *)CONCAT71(local_23e8.ptr_._1_7_,local_23e8.ptr_._0_1_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,local_23e0[0]._8_8_ - (long)pvVar2);
  }
  if ((pointer)local_1478._0_8_ != pcVar1) {
    operator_delete((void *)local_1478._0_8_,local_1478._16_8_ + 1);
  }
  local_1260 = 1;
  local_1478._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1478,"0014f330ed8383f8afdc977dd88600eb8ff120ba15e4","");
  cfd::core::Script::Script((Script *)local_23f0,(string *)local_1478);
  cfd::core::Script::operator=(local_1258,(Script *)local_23f0);
  cfd::core::Script::~Script((Script *)local_23f0);
  if ((pointer)local_1478._0_8_ != pcVar1) {
    operator_delete((void *)local_1478._0_8_,local_1478._16_8_ + 1);
  }
  local_1478._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1478,"bcrt1q7vcwmqurlzhae9mamzrqp6u07yst590y5ujv3w","");
  cfd::AddressFactory::GetAddress((Address *)local_23f0,&local_2558,(string *)local_1478);
  cfd::core::Address::operator=(&local_11e8,(Address *)local_23f0);
  cfd::core::Address::~Address((Address *)local_23f0);
  if ((pointer)local_1478._0_8_ != pcVar1) {
    operator_delete((void *)local_1478._0_8_,local_1478._16_8_ + 1);
  }
  std::__cxx11::string::_M_replace((ulong)local_1068,0,local_1060,0x5b667a);
  cfd::core::Amount::Amount((Amount *)local_23f0,50000000000000);
  local_1048.ignore_check_ = local_23e8.ptr_._0_1_;
  local_1048.amount_ = (int64_t)local_23f0;
  local_1038 = kP2wpkhAddress;
  local_23f0 = (undefined1  [8])local_23e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_23f0,"mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo","");
  cfd::core::Address::Address((Address *)local_1478,(string *)local_23f0);
  if (local_23f0 != (undefined1  [8])local_23e0) {
    operator_delete((void *)local_23f0,(ulong)(local_23e0[0]._M_allocated_capacity + 1));
  }
  local_23f0 = (undefined1  [8])local_23e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_23f0,"bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu","");
  cfd::core::Address::Address(&local_1b0,(string *)local_23f0);
  if (local_23f0 != (undefined1  [8])local_23e0) {
    operator_delete((void *)local_23f0,(ulong)(local_23e0[0]._M_allocated_capacity + 1));
  }
  local_23f0 = (undefined1  [8])local_23e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_23f0,"bcrt1q7vcwmqurlzhae9mamzrqp6u07yst590y5ujv3w","");
  cfd::core::Address::Address(&local_330,(string *)local_23f0);
  if (local_23f0 != (undefined1  [8])local_23e0) {
    operator_delete((void *)local_23f0,(ulong)(local_23e0[0]._M_allocated_capacity + 1));
  }
  cfd::core::Amount::Amount(&local_2520,10000);
  cfd::TransactionContext::TransactionContext(&local_2510,2,0);
  AVar7 = cfd::core::operator+(&local_858.amount,&local_1048);
  local_2458._0_8_ = AVar7.amount_;
  local_2458[8] = AVar7.ignore_check_;
  AVar7 = cfd::core::operator-((Amount *)local_2458,&local_2520);
  local_23f0 = (undefined1  [8])AVar7.amount_;
  local_23e8.ptr_._0_1_ = AVar7.ignore_check_;
  cfd::TransactionContext::AddTxOut(&local_2510,(Address *)local_1478,(Amount *)local_23f0);
  cfd::TransactionContext::AddTxOut(&local_2510,&local_1b0,&local_b20);
  cfd::UtxoData::UtxoData((UtxoData *)local_23f0,&local_858);
  cfd::UtxoData::UtxoData(&local_1ec8,(UtxoData *)local_d80);
  cfd::UtxoData::UtxoData(&local_19a0,(UtxoData *)local_12a8);
  __l._M_len = 3;
  __l._M_array = (iterator)local_23f0;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&local_25a8,__l,(allocator_type *)local_2458);
  lVar6 = 0xa50;
  do {
    cfd::UtxoData::~UtxoData((UtxoData *)(local_23f0 + lVar6));
    lVar6 = lVar6 + -0x528;
  } while (lVar6 != -0x528);
  cfd::CoinSelectionOption::CoinSelectionOption((CoinSelectionOption *)local_2458);
  local_25c8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_25c8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_25c8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Amount::Amount(&local_2530);
  cfd::core::Amount::Amount(&local_2590);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)local_23f0,(AbstractTransaction *)&local_2510);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_2660,&local_330);
  cfd::api::TransactionApi::FundRawTransaction
            (&local_12f8,&local_2619,(string *)local_23f0,&local_25a8,&local_2530,&local_25c8,
             (string *)local_2660,20.0,&local_2590,(UtxoFilter *)0x0,
             (CoinSelectionOption *)local_2458,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0,kCfdIllegalStateError,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,(Amount *)0x0);
  if (local_2660 != (undefined1  [8])&local_2650) {
    operator_delete((void *)local_2660,local_2650._M_allocated_capacity + 1);
  }
  if (local_23f0 != (undefined1  [8])local_23e0) {
    operator_delete((void *)local_23f0,(ulong)(local_23e0[0]._M_allocated_capacity + 1));
  }
  local_2660 = (undefined1  [8])cfd::core::Amount::GetSatoshiValue(&local_2590);
  local_2640.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_2640.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,0x20a8);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_23f0,"estimate_fee.GetSatoshiValue()","8360",(long *)local_2660,
             (int *)&local_2640);
  if (local_23f0[0] == (string)0x0) {
    testing::Message::Message((Message *)local_2660);
    if ((undefined8 *)CONCAT71(local_23e8.ptr_._1_7_,local_23e8.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT71(local_23e8.ptr_._1_7_,local_23e8.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2640,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x163,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2640,(Message *)local_2660);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2640);
    if (local_2660 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2660 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2660 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_23e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::AbstractTransactionController::GetHex_abi_cxx11_
            ((string *)local_2660,&local_12f8.super_AbstractTransactionController);
  cfd::TransactionContext::TransactionContext((TransactionContext *)local_23f0,(string *)local_2660)
  ;
  cfd::TransactionContext::operator=(&local_2510,(TransactionContext *)local_23f0);
  cfd::TransactionContext::~TransactionContext((TransactionContext *)local_23f0);
  if (local_2660 != (undefined1  [8])&local_2650) {
    operator_delete((void *)local_2660,local_2650._M_allocated_capacity + 1);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::TransactionContext::CollectInputUtxo(&local_2510,&local_25a8);
    }
  }
  else {
    testing::Message::Message((Message *)local_23f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x166,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2660,(Message *)local_23f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2660);
    if (local_23f0 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_23f0 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_23f0 + 8))();
      }
    }
  }
  cfd::core::ByteData::ByteData(&local_25e0);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_23f0,this_00,local_858.vout);
      local_2660 = (undefined1  [8])&local_2650;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2660,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
      cfd::core::Pubkey::Pubkey(&local_2618,(string *)local_2660);
      local_2600._M_dataplus._M_p = (pointer)&local_2600.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2600,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
      cfd::core::Privkey::FromWif(&local_2640,&local_2600,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_2564);
      cfd::TransactionContext::SignWithKey
                (&local_2510,(OutPoint *)local_23f0,&local_2618,&local_2640,&local_2564,true,
                 (ByteData256 *)0x0,(ByteData *)0x0);
      if (local_2640.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2640.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2640.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2640.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2600._M_dataplus._M_p != &local_2600.field_2) {
        operator_delete(local_2600._M_dataplus._M_p,local_2600.field_2._M_allocated_capacity + 1);
      }
      if (local_2618.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2618.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2618.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2618.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2660 != (undefined1  [8])&local_2650) {
        operator_delete((void *)local_2660,local_2650._M_allocated_capacity + 1);
      }
      local_23f0 = (undefined1  [8])&PTR__Txid_0086d9f8;
      pvVar2 = (void *)CONCAT71(local_23e8.ptr_._1_7_,local_23e8.ptr_._0_1_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,local_23e0[0]._8_8_ - (long)pvVar2);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_23f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x16d,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2660,(Message *)local_23f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2660);
    if (local_23f0 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_23f0 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_23f0 + 8))();
      }
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_23f0,this_00,local_858.vout);
      cfd::TransactionContext::Verify(&local_2510,(OutPoint *)local_23f0);
      local_23f0 = (undefined1  [8])&PTR__Txid_0086d9f8;
      pvVar2 = (void *)CONCAT71(local_23e8.ptr_._1_7_,local_23e8.ptr_._0_1_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,local_23e0[0]._8_8_ - (long)pvVar2);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_23f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x16e,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2660,(Message *)local_23f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2660);
    if (local_23f0 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_23f0 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_23f0 + 8))();
      }
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    cfd::TransactionContext::Finalize((ByteData *)local_23f0,&local_2510);
    cfd::core::ByteData::operator=(&local_25e0,(ByteData *)local_23f0);
    if (local_23f0 != (undefined1  [8])0x0) {
      operator_delete((void *)local_23f0,local_23e0[0]._M_allocated_capacity - (long)local_23f0);
    }
  }
  testing::Message::Message((Message *)local_23f0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_2660,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
             ,0x16f,
             "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_2660,(Message *)local_23f0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2660);
  if (local_23f0 != (undefined1  [8])0x0) {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) && (local_23f0 != (undefined1  [8])0x0)) {
      (**(code **)(*(size_type *)local_23f0 + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_23f0,&local_d58,local_d38);
      local_2660 = (undefined1  [8])&local_2650;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2660,
                 "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27","");
      cfd::core::Pubkey::Pubkey(&local_2618,(string *)local_2660);
      local_2600._M_dataplus._M_p = (pointer)&local_2600.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2600,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP","");
      cfd::core::Privkey::FromWif(&local_2640,&local_2600,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_2570);
      cfd::TransactionContext::SignWithKey
                (&local_2510,(OutPoint *)local_23f0,&local_2618,&local_2640,&local_2570,true,
                 (ByteData256 *)0x0,(ByteData *)0x0);
      if (local_2640.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2640.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2640.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2640.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2600._M_dataplus._M_p != &local_2600.field_2) {
        operator_delete(local_2600._M_dataplus._M_p,local_2600.field_2._M_allocated_capacity + 1);
      }
      if (local_2618.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2618.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2618.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2618.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2660 != (undefined1  [8])&local_2650) {
        operator_delete((void *)local_2660,local_2650._M_allocated_capacity + 1);
      }
      local_23f0 = (undefined1  [8])&PTR__Txid_0086d9f8;
      pvVar2 = (void *)CONCAT71(local_23e8.ptr_._1_7_,local_23e8.ptr_._0_1_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,local_23e0[0]._8_8_ - (long)pvVar2);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_23f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x174,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2660,(Message *)local_23f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2660);
    if (local_23f0 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_23f0 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_23f0 + 8))();
      }
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_23f0,&local_d58,local_d38);
      cfd::TransactionContext::Verify(&local_2510,(OutPoint *)local_23f0);
      local_23f0 = (undefined1  [8])&PTR__Txid_0086d9f8;
      pvVar2 = (void *)CONCAT71(local_23e8.ptr_._1_7_,local_23e8.ptr_._0_1_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,local_23e0[0]._8_8_ - (long)pvVar2);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_23f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x175,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2660,(Message *)local_23f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2660);
    if (local_23f0 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_23f0 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_23f0 + 8))();
      }
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    cfd::TransactionContext::Finalize((ByteData *)local_23f0,&local_2510);
    cfd::core::ByteData::operator=(&local_25e0,(ByteData *)local_23f0);
    if (local_23f0 != (undefined1  [8])0x0) {
      operator_delete((void *)local_23f0,local_23e0[0]._M_allocated_capacity - (long)local_23f0);
    }
  }
  testing::Message::Message((Message *)local_23f0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_2660,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
             ,0x176,
             "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_2660,(Message *)local_23f0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2660);
  if (local_23f0 != (undefined1  [8])0x0) {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) && (local_23f0 != (undefined1  [8])0x0)) {
      (**(code **)(*(size_type *)local_23f0 + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_23f0,&local_1280,local_1260);
      local_2660 = (undefined1  [8])&local_2650;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2660,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
      cfd::core::Pubkey::Pubkey(&local_2618,(string *)local_2660);
      local_2600._M_dataplus._M_p = (pointer)&local_2600.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2600,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
      cfd::core::Privkey::FromWif(&local_2640,&local_2600,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_257c);
      cfd::TransactionContext::SignWithKey
                (&local_2510,(OutPoint *)local_23f0,&local_2618,&local_2640,&local_257c,true,
                 (ByteData256 *)0x0,(ByteData *)0x0);
      if (local_2640.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2640.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2640.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2640.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2600._M_dataplus._M_p != &local_2600.field_2) {
        operator_delete(local_2600._M_dataplus._M_p,local_2600.field_2._M_allocated_capacity + 1);
      }
      if (local_2618.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2618.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2618.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2618.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2660 != (undefined1  [8])&local_2650) {
        operator_delete((void *)local_2660,local_2650._M_allocated_capacity + 1);
      }
      local_23f0 = (undefined1  [8])&PTR__Txid_0086d9f8;
      pvVar2 = (void *)CONCAT71(local_23e8.ptr_._1_7_,local_23e8.ptr_._0_1_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,local_23e0[0]._8_8_ - (long)pvVar2);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_23f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x17b,
               "Expected: txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2660,(Message *)local_23f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2660);
    if (local_23f0 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_23f0 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_23f0 + 8))();
      }
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_23f0,&local_1280,local_1260);
      cfd::TransactionContext::Verify(&local_2510,(OutPoint *)local_23f0);
      local_23f0 = (undefined1  [8])&PTR__Txid_0086d9f8;
      pvVar2 = (void *)CONCAT71(local_23e8.ptr_._1_7_,local_23e8.ptr_._0_1_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,local_23e0[0]._8_8_ - (long)pvVar2);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_23f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x17c,
               "Expected: txc.Verify(OutPoint(utxo3.txid, utxo3.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2660,(Message *)local_23f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2660);
    if (local_23f0 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_23f0 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_23f0 + 8))();
      }
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::TransactionContext::Finalize((ByteData *)local_23f0,&local_2510);
      cfd::core::ByteData::operator=(&local_25e0,(ByteData *)local_23f0);
      if (local_23f0 != (undefined1  [8])0x0) {
        operator_delete((void *)local_23f0,local_23e0[0]._M_allocated_capacity - (long)local_23f0);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_23f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x17e,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2660,(Message *)local_23f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2660);
    if (local_23f0 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_23f0 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_23f0 + 8))();
      }
    }
  }
  AVar7 = cfd::TransactionContext::GetFeeAmount(&local_2510);
  local_2660 = (undefined1  [8])AVar7.amount_;
  local_2658.ptr_._0_1_ = AVar7.ignore_check_;
  local_2640.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)cfd::core::Amount::GetSatoshiValue((Amount *)local_2660);
  local_2600._M_dataplus._M_p = (pointer)cfd::core::Amount::GetSatoshiValue(&local_2590);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_23f0,"txc.GetFeeAmount().GetSatoshiValue()",
             "estimate_fee.GetSatoshiValue()",(long *)&local_2640,(long *)&local_2600);
  if (local_23f0[0] == (string)0x0) {
    testing::Message::Message((Message *)local_2660);
    if ((undefined8 *)CONCAT71(local_23e8.ptr_._1_7_,local_23e8.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT71(local_23e8.ptr_._1_7_,local_23e8.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2640,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x17f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2640,(Message *)local_2660);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2640);
    if (local_2660 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2660 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_2660 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_23e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_23f0,&local_25e0);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2660,"tx.GetHex().c_str()",
             "\"02000000000103e3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a473044022029f4ce58206fe107b1dd6cbaf3246391a55cdd639cce10fdf545a8c131e17ebf022022b47d656c8666b188c6b16f9e10f6718bbbd420c390fe7a039f9c4323596d1c01210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffff03f0187a10f35a00001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac00008d49fd1a070016001445663e592ff613587f0fdd6e74034c5239710dca6806000000000000160014f330ed8383f8afdc977dd88600eb8ff120ba15e40247304402204f83d997acfadec69e45d1719794850ebc3f5bee41057aeefefed8e678e0ed6802206c7653837d7b70343b0dac4f47170b261885c4fcad35b346d0da02d0cc342b7b01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270247304402206089cce85471b83b7afafc4c8363ca10124d831914a27817fa77e27e5a5f5b2e02200cf2c185a1caa93f84ecd25cc4b67cbf04ba3857ca4310688245a53491b9e6f601210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000\""
             ,(char *)local_23f0,
             "02000000000103e3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a473044022029f4ce58206fe107b1dd6cbaf3246391a55cdd639cce10fdf545a8c131e17ebf022022b47d656c8666b188c6b16f9e10f6718bbbd420c390fe7a039f9c4323596d1c01210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffff03f0187a10f35a00001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac00008d49fd1a070016001445663e592ff613587f0fdd6e74034c5239710dca6806000000000000160014f330ed8383f8afdc977dd88600eb8ff120ba15e40247304402204f83d997acfadec69e45d1719794850ebc3f5bee41057aeefefed8e678e0ed6802206c7653837d7b70343b0dac4f47170b261885c4fcad35b346d0da02d0cc342b7b01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270247304402206089cce85471b83b7afafc4c8363ca10124d831914a27817fa77e27e5a5f5b2e02200cf2c185a1caa93f84ecd25cc4b67cbf04ba3857ca4310688245a53491b9e6f601210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000"
            );
  if (local_23f0 != (undefined1  [8])local_23e0) {
    operator_delete((void *)local_23f0,(ulong)(local_23e0[0]._M_allocated_capacity + 1));
  }
  if (local_2660[0] == (string)0x0) {
    testing::Message::Message((Message *)local_23f0);
    if ((undefined8 *)CONCAT71(local_2658.ptr_._1_7_,local_2658.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT71(local_2658.ptr_._1_7_,local_2658.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2640,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x180,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2640,(Message *)local_23f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2640);
    if (local_23f0 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_23f0 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_23f0 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2658,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar4 = cfd::core::Transaction::GetVsize(&local_2510.super_Transaction);
  local_2660._0_4_ = uVar4;
  local_2640.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_2640.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,0x19d);
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_23f0,"txc.GetVsize()","413",(uint *)local_2660,(int *)&local_2640);
  if (local_23f0[0] == (string)0x0) {
    testing::Message::Message((Message *)local_2660);
    if ((undefined8 *)CONCAT71(local_23e8.ptr_._1_7_,local_23e8.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT71(local_23e8.ptr_._1_7_,local_23e8.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2640,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x181,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2640,(Message *)local_2660);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2640);
    if (local_2660 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2660 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_2660 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_23e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar4 = cfd::core::Transaction::GetVsize(&local_2510.super_Transaction);
  local_2600._M_dataplus._M_p._0_4_ = uVar4 * 0x14;
  local_2660._0_4_ = 0x2044;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_23f0,"minimum_fee","8260",(uint *)&local_2600,(int *)local_2660);
  if (local_23f0[0] == (string)0x0) {
    testing::Message::Message((Message *)local_2660);
    if ((undefined8 *)CONCAT71(local_23e8.ptr_._1_7_,local_23e8.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT71(local_23e8.ptr_._1_7_,local_23e8.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2640,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x184,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2640,(Message *)local_2660);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2640);
    if (local_2660 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2660 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_2660 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_23e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_25e0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_25e0.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_25e0.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_25e0.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_12f8.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)&PTR__TransactionController_0086f198;
  cfd::core::Transaction::~Transaction(&local_12f8.transaction_);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_25c8);
  local_2420 = &PTR__ConfidentialAssetId_0086dd08;
  if (local_2418 != (pointer)0x0) {
    operator_delete(local_2418,(long)local_2408 - (long)local_2418);
  }
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_25a8);
  cfd::TransactionContext::~TransactionContext(&local_2510);
  cfd::core::Address::~Address(&local_330);
  cfd::core::Address::~Address(&local_1b0);
  cfd::core::Address::~Address((Address *)local_1478);
  cfd::UtxoData::~UtxoData((UtxoData *)local_12a8);
  cfd::UtxoData::~UtxoData((UtxoData *)local_d80);
  cfd::UtxoData::~UtxoData(&local_858);
  local_2558._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_0086bad8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_2558.prefix_list_);
  return;
}

Assistant:

TEST(TransactionApi, FundRawTransaction_LimitAmountValue) {
  AddressFactory factory(NetType::kRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("n3gq7EMkVLyrpSxVxKLFX8qsqiDC5DcqfW");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{50000000000000});
  utxo1.address_type = AddressType::kP2pkhAddress;

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("2N1kiV9NkmZetZ3j7FuWGkBZxubBMPLxJ16");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{2000000000000000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;

  // Address3
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo3.vout = 1;
  utxo3.locking_script = Script("0014f330ed8383f8afdc977dd88600eb8ff120ba15e4");
  // utxo1.redeem_script = Script("");
  utxo3.address = factory.GetAddress("bcrt1q7vcwmqurlzhae9mamzrqp6u07yst590y5ujv3w");
  utxo3.descriptor = "wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo3.amount = Amount(int64_t{50000000000000});
  utxo3.address_type = AddressType::kP2wpkhAddress;

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address("mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo");
  // "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"
  Address address2("bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu");
  Address address3("bcrt1q7vcwmqurlzhae9mamzrqp6u07yst590y5ujv3w");

  Amount fee(int64_t{10000});
  TransactionContext txc(2, 0);
  txc.AddTxOut(address, utxo1.amount + utxo3.amount - fee);
  txc.AddTxOut(address2, utxo2.amount);

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};

  double effective_fee_rate = 20.0;
  CoinSelectionOption option;
  std::vector<UtxoData> selected_txin_utxos;
  Amount target_value;
  Amount estimate_fee;


  TransactionApi api;
  auto tx_obj = api.FundRawTransaction(
      txc.GetHex(), utxos, target_value, selected_txin_utxos, address3.GetAddress(),
      effective_fee_rate, &estimate_fee, nullptr, &option, nullptr, NetType::kRegtest);
  EXPECT_EQ(estimate_fee.GetSatoshiValue(), 8360);

  txc = TransactionContext(tx_obj.GetHex());
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo3.txid, utxo3.vout)));

  EXPECT_NO_THROW(tx = txc.Finalize());
  EXPECT_EQ(txc.GetFeeAmount().GetSatoshiValue(), estimate_fee.GetSatoshiValue());
  EXPECT_STREQ(tx.GetHex().c_str(), "02000000000103e3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a473044022029f4ce58206fe107b1dd6cbaf3246391a55cdd639cce10fdf545a8c131e17ebf022022b47d656c8666b188c6b16f9e10f6718bbbd420c390fe7a039f9c4323596d1c01210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffff03f0187a10f35a00001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac00008d49fd1a070016001445663e592ff613587f0fdd6e74034c5239710dca6806000000000000160014f330ed8383f8afdc977dd88600eb8ff120ba15e40247304402204f83d997acfadec69e45d1719794850ebc3f5bee41057aeefefed8e678e0ed6802206c7653837d7b70343b0dac4f47170b261885c4fcad35b346d0da02d0cc342b7b01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270247304402206089cce85471b83b7afafc4c8363ca10124d831914a27817fa77e27e5a5f5b2e02200cf2c185a1caa93f84ecd25cc4b67cbf04ba3857ca4310688245a53491b9e6f601210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000");
  EXPECT_EQ(txc.GetVsize(), 413);

  uint32_t minimum_fee = txc.GetVsize() * static_cast<uint32_t>(effective_fee_rate);
  EXPECT_EQ(minimum_fee, 8260);
}